

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NamedLabelSyntax *args_2;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *alloc;
  StatementSyntax *node;
  TimingControlStatementSyntax *pTVar1;
  BumpAllocator *in_stack_00000078;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000080;
  BumpAllocator *in_stack_ffffffffffffffc8;
  NamedLabelSyntax *in_stack_ffffffffffffffd0;
  NamedLabelSyntax *args;
  BumpAllocator *pBVar2;
  
  pBVar2 = (BumpAllocator *)__child_stack;
  if (*(long *)(__fn + 0x18) == 0) {
    args_2 = (NamedLabelSyntax *)0x0;
  }
  else {
    args_2 = deepClone<slang::syntax::NamedLabelSyntax>
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  args = args_2;
  alloc = deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000080,in_stack_00000078);
  not_null<slang::syntax::TimingControlSyntax_*>::operator*
            ((not_null<slang::syntax::TimingControlSyntax_*> *)0x77d1d6);
  node = (StatementSyntax *)
         deepClone<slang::syntax::TimingControlSyntax>
                   ((TimingControlSyntax *)in_stack_ffffffffffffffd0,(BumpAllocator *)alloc);
  not_null<slang::syntax::StatementSyntax_*>::operator*
            ((not_null<slang::syntax::StatementSyntax_*> *)0x77d1f6);
  deepClone<slang::syntax::StatementSyntax>(node,(BumpAllocator *)alloc);
  pTVar1 = BumpAllocator::
           emplace<slang::syntax::TimingControlStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::TimingControlSyntax&,slang::syntax::StatementSyntax&>
                     (pBVar2,(NamedLabelSyntax **)args,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__child_stack,
                      (TimingControlSyntax *)args_2,node);
  return (int)pTVar1;
}

Assistant:

static SyntaxNode* clone(const TimingControlStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<TimingControlStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        *deepClone<TimingControlSyntax>(*node.timingControl, alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}